

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O1

Status __thiscall
leveldb::DBImpl::WriteLevel0Table(DBImpl *this,MemTable *mem,VersionEdit *edit,Version *base)

{
  Comparator **__mutex;
  atomic<unsigned_long> *this_00;
  size_t *psVar1;
  pointer *pppcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Logger *info_log;
  uint64_t uVar4;
  uint64_t uVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  Iterator *iter;
  undefined4 extraout_var_00;
  long lVar8;
  Version *in_R8;
  pair<std::_Rb_tree_iterator<unsigned_long>,_std::_Rb_tree_iterator<unsigned_long>_> pVar9;
  Slice min_user_key;
  FileMetaData meta;
  Slice max_user_key;
  string local_b8;
  FileMetaData local_98;
  Slice local_40;
  
  __mutex = &mem[0x14].comparator_.comparator.user_comparator_;
  iVar6 = (*((mem->comparator_).comparator.user_comparator_)->_vptr_Comparator[0x13])();
  local_98.smallest.rep_._M_dataplus._M_p = (pointer)&local_98.smallest.rep_.field_2;
  local_98.refs = 0;
  local_98.allowed_seeks = 0x40000000;
  local_98.file_size = 0;
  local_98.smallest.rep_._M_string_length = 0;
  local_98.smallest.rep_.field_2._M_local_buf[0] = '\0';
  local_98.largest.rep_._M_dataplus._M_p = (pointer)&local_98.largest.rep_.field_2;
  local_98.largest.rep_._M_string_length = 0;
  local_98.largest.rep_.field_2._M_local_buf[0] = '\0';
  local_98.number = *(uint64_t *)(*(long *)&mem[0x17].refs_ + 0x48);
  *(uint64_t *)(*(long *)&mem[0x17].refs_ + 0x48) = local_98.number + 1;
  this_00 = &mem[0x16].arena_.memory_usage_;
  std::
  _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
  ::_M_insert_unique<unsigned_long_const&>
            ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
              *)this_00,&local_98.number);
  iter = MemTable::NewIterator((MemTable *)edit);
  Log((Logger *)(mem->table_).compare_.comparator.super_Comparator._vptr_Comparator,
      "Level-0 table #%llu: started",local_98.number);
  (this->super_DB)._vptr_DB = (_func_int **)0x0;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  BuildTable((leveldb *)&local_b8,(string *)&mem[0x13].table_,
             (Env *)(mem->comparator_).comparator.user_comparator_,
             (Options *)
             &(mem->arena_).blocks_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_finish,*(TableCache **)&mem[0x13].table_.max_height_,iter,
             &local_98);
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(this->super_DB)._vptr_DB;
  (this->super_DB)._vptr_DB = (_func_int **)local_b8._M_dataplus._M_p;
  local_b8._M_dataplus._M_p = (pointer)paVar3;
  if (paVar3 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
    operator_delete__(paVar3);
  }
  iVar7 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  uVar5 = local_98.file_size;
  uVar4 = local_98.number;
  if (iVar7 == 0) {
    info_log = (Logger *)(mem->table_).compare_.comparator.super_Comparator._vptr_Comparator;
    Status::ToString_abi_cxx11_(&local_b8,(Status *)this);
    Log(info_log,"Level-0 table #%llu: %lld bytes %s",uVar4,uVar5,local_b8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if (iter != (Iterator *)0x0) {
      (*iter->_vptr_Iterator[1])(iter);
    }
    pVar9 = std::
            _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
            ::equal_range((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                           *)this_00,&local_98.number);
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::_M_erase_aux((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)this_00,(_Base_ptr)pVar9.first._M_node,(_Base_ptr)pVar9.second._M_node);
    lVar8 = 0;
    if (((this->super_DB)._vptr_DB == (_func_int **)0x0) && (local_98.file_size != 0)) {
      local_b8._M_string_length = local_98.smallest.rep_._M_string_length - 8;
      local_b8._M_dataplus._M_p = local_98.smallest.rep_._M_dataplus._M_p;
      local_40.size_ = local_98.largest.rep_._M_string_length - 8;
      local_40.data_ = local_98.largest.rep_._M_dataplus._M_p;
      if (in_R8 == (Version *)0x0) {
        iVar7 = 0;
      }
      else {
        iVar7 = Version::PickLevelForMemTableOutput(in_R8,(Slice *)&local_b8,&local_40);
      }
      VersionEdit::AddFile
                ((VersionEdit *)base,iVar7,local_98.number,local_98.file_size,&local_98.smallest,
                 &local_98.largest);
      lVar8 = (long)iVar7;
    }
    iVar7 = (*((mem->comparator_).comparator.user_comparator_)->_vptr_Comparator[0x13])();
    psVar1 = &mem[0x17].arena_.alloc_bytes_remaining_ + lVar8 * 3;
    *psVar1 = *psVar1 + (CONCAT44(extraout_var_00,iVar7) - CONCAT44(extraout_var,iVar6));
    pppcVar2 = &(&mem[0x17].arena_.blocks_)[lVar8].
                super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
                _M_finish;
    *pppcVar2 = (pointer)((long)*pppcVar2 + local_98.file_size);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.largest.rep_._M_dataplus._M_p != &local_98.largest.rep_.field_2) {
      operator_delete(local_98.largest.rep_._M_dataplus._M_p,
                      CONCAT71(local_98.largest.rep_.field_2._M_allocated_capacity._1_7_,
                               local_98.largest.rep_.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.smallest.rep_._M_dataplus._M_p != &local_98.smallest.rep_.field_2) {
      operator_delete(local_98.smallest.rep_._M_dataplus._M_p,
                      CONCAT71(local_98.smallest.rep_.field_2._M_allocated_capacity._1_7_,
                               local_98.smallest.rep_.field_2._M_local_buf[0]) + 1);
    }
    return (Status)(char *)this;
  }
  std::__throw_system_error(iVar7);
}

Assistant:

Status DBImpl::WriteLevel0Table(MemTable* mem, VersionEdit* edit,
                                Version* base) {
  mutex_.AssertHeld();
  const uint64_t start_micros = env_->NowMicros();
  FileMetaData meta;
  meta.number = versions_->NewFileNumber();
  pending_outputs_.insert(meta.number);
  Iterator* iter = mem->NewIterator();
  Log(options_.info_log, "Level-0 table #%llu: started",
      (unsigned long long)meta.number);

  Status s;
  {
    mutex_.Unlock();
    s = BuildTable(dbname_, env_, options_, table_cache_, iter, &meta);
    mutex_.Lock();
  }

  Log(options_.info_log, "Level-0 table #%llu: %lld bytes %s",
      (unsigned long long)meta.number, (unsigned long long)meta.file_size,
      s.ToString().c_str());
  delete iter;
  pending_outputs_.erase(meta.number);

  // Note that if file_size is zero, the file has been deleted and
  // should not be added to the manifest.
  int level = 0;
  if (s.ok() && meta.file_size > 0) {
    const Slice min_user_key = meta.smallest.user_key();
    const Slice max_user_key = meta.largest.user_key();
    if (base != nullptr) {
      level = base->PickLevelForMemTableOutput(min_user_key, max_user_key);
    }
    edit->AddFile(level, meta.number, meta.file_size, meta.smallest,
                  meta.largest);
  }

  CompactionStats stats;
  stats.micros = env_->NowMicros() - start_micros;
  stats.bytes_written = meta.file_size;
  stats_[level].Add(stats);
  return s;
}